

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O3

void PrintInstruction(InstructionVMGraphContext *ctx,VmInstruction *instruction)

{
  byte *pbVar1;
  char *pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  SynBase *pSVar7;
  TypeBase *pTVar8;
  VmValue **ppVVar9;
  VmValue *pVVar10;
  VmValue *value;
  VmInstruction *instruction_00;
  int iVar11;
  undefined4 extraout_EAX;
  int iVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint local_50;
  
  if (((ctx->showSource == true) &&
      (pSVar7 = (instruction->super_VmValue).source, pSVar7 != (SynBase *)0x0)) &&
     (pSVar7->isInternal == false)) {
    pcVar15 = (pSVar7->pos).begin;
    iVar11 = -(int)pcVar15;
    uVar16 = 0;
    lVar20 = 0;
    do {
      lVar14 = lVar20;
      uVar21 = (ulong)uVar16;
      pcVar2 = pcVar15 + lVar14;
      if ((pcVar2 <= ctx->code) || (pcVar15[lVar14 + -1] == '\r')) break;
      uVar16 = uVar16 + 1;
      lVar20 = lVar14 + -1;
    } while (pcVar15[lVar14 + -1] != '\n');
    uVar17 = -lVar14;
    pcVar18 = pcVar15;
    do {
      do {
        pbVar1 = (byte *)(pcVar18 + 1);
        pcVar18 = pcVar18 + 1;
      } while (0xd < *pbVar1);
    } while ((0x2401U >> (*pbVar1 & 0x1f) & 1) == 0);
    if (ctx->showAnnotatedSource == true) {
      iVar12 = (int)lVar14;
      iVar13 = (int)(pSVar7->pos).end;
      if (((pcVar2 != ctx->lastStart) || (-ctx->lastStartOffset != iVar12)) ||
         ((iVar13 - ctx->lastEndOffset) + iVar11 != iVar12)) {
        uVar16 = (iVar11 + iVar13) - iVar12;
        Print(ctx,"// %.*s");
        OutputContext::Print(ctx->output,"\n",1);
        PrintIndent(ctx);
        local_50 = (uint)uVar17;
        if ((((instruction->super_VmValue).source)->pos).end < pcVar18) {
          Print(ctx,"// ");
          if (iVar12 != 0) {
            uVar19 = 0;
            do {
              Print(ctx," ");
              if (pcVar15[lVar14 + uVar19] == '\t') {
                pcVar18 = "   ";
                if (uVar19 == 0) {
                  pcVar18 = "  ";
                }
                Print(ctx,pcVar18);
              }
              uVar19 = uVar19 + 1;
            } while ((uVar17 & 0xffffffff) != uVar19);
          }
          if (local_50 < uVar16) {
            lVar20 = 0;
            do {
              Print(ctx,"~");
              if (pcVar15[lVar14 + lVar20 + uVar21] == '\t') {
                pcVar18 = "~~~";
                if (-(uVar17 & 0xffffffff) == lVar20) {
                  pcVar18 = "~~";
                }
                Print(ctx,pcVar18);
              }
              lVar20 = lVar20 + 1;
            } while (iVar13 - (int)pcVar15 != (int)lVar20);
          }
          OutputContext::Print(ctx->output,"\n",1);
          PrintIndent(ctx);
        }
        ctx->lastStart = pcVar2;
        ctx->lastStartOffset = local_50;
        ctx->lastEndOffset = uVar16;
      }
    }
    else if (pcVar2 != ctx->lastStart) {
      Print(ctx,"// %.*s");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      ctx->lastStart = pcVar2;
    }
  }
  PrintUsers(ctx,&instruction->super_VmValue,false);
  if (((instruction->super_VmValue).type.type != VM_TYPE_VOID) ||
     ((instruction->super_VmValue).type.size != 0)) {
    if (ctx->showTypes == true) {
      PrintType(ctx,(instruction->super_VmValue).type);
      Print(ctx," ");
    }
    Print(ctx,"%%%d",(ulong)instruction->uniqueId);
    if (instruction->color != 0) {
      Print(ctx,".c%d");
    }
    if ((instruction->regVmRegisters).count != 0) {
      Print(ctx,".r");
      if ((instruction->regVmRegisters).count != 0) {
        uVar21 = 0;
        do {
          pcVar15 = "|%d";
          if (uVar21 == 0) {
            pcVar15 = "%d";
          }
          Print(ctx,pcVar15,(ulong)(instruction->regVmRegisters).data[uVar21]);
          uVar21 = uVar21 + 1;
        } while (uVar21 < (instruction->regVmRegisters).count);
      }
    }
    if (ctx->showComments == true) {
      pcVar15 = (instruction->super_VmValue).comment.begin;
      pcVar2 = (instruction->super_VmValue).comment.end;
      if (pcVar15 != pcVar2) {
        Print(ctx," (%.*s)",(ulong)(uint)((int)pcVar2 - (int)pcVar15));
      }
    }
    if (ctx->showFullTypes == true) {
      pTVar8 = (instruction->super_VmValue).type.structType;
      if (pTVar8 == (TypeBase *)0x0) {
        Print(ctx," <");
        PrintType(ctx,(instruction->super_VmValue).type);
        Print(ctx,">");
      }
      else {
        Print(ctx," <%.*s>",(ulong)(uint)(*(int *)&(pTVar8->name).end - (int)(pTVar8->name).begin));
      }
    }
    Print(ctx," = ");
  }
  pcVar15 = GetInstructionName(instruction);
  Print(ctx,"%s",pcVar15);
  if (instruction->cmd == VM_INST_PHI) {
    Print(ctx," [");
    uVar16 = (instruction->arguments).count;
    uVar21 = (ulong)uVar16;
    if (uVar16 != 0) {
      uVar17 = 0;
      do {
        if (uVar21 <= uVar17 + 1) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                       );
        }
        ppVVar9 = (instruction->arguments).data;
        pVVar10 = ppVVar9[uVar17];
        value = ppVVar9[uVar17 + 1];
        if (uVar17 != 0) {
          Print(ctx,", ");
        }
        PrintName(ctx,pVVar10,false,false);
        Print(ctx," from ");
        PrintName(ctx,value,false,false);
        uVar17 = uVar17 + 2;
        uVar21 = (ulong)(instruction->arguments).count;
      } while (uVar17 < uVar21);
    }
    Print(ctx,"]");
  }
  else {
    if (ctx->displayAsTree != false) {
      uVar3 = (instruction->super_VmValue).type.type;
      uVar5 = (instruction->super_VmValue).type.size;
      auVar22._4_4_ = -(uint)(uVar3 == 0);
      auVar22._0_4_ = -(uint)(uVar3 == 0);
      auVar22._8_4_ = -(uint)(uVar5 == 0);
      auVar22._12_4_ = -(uint)(uVar5 == 0);
      iVar11 = movmskpd(extraout_EAX,auVar22);
      if (iVar11 == 3) {
        Print(ctx," // %%%d",(ulong)instruction->uniqueId);
      }
      OutputContext::Print(ctx->output,"\n",1);
      uVar16 = ctx->depth;
      ctx->depth = uVar16 + 1;
      if ((instruction->arguments).count != 0) {
        uVar21 = 0;
        do {
          instruction_00 = (VmInstruction *)(instruction->arguments).data[uVar21];
          PrintIndent(ctx);
          if (((instruction_00 == (VmInstruction *)0x0) ||
              ((instruction_00->super_VmValue).typeID != 2)) ||
             ((instruction_00->super_VmValue).users.count == 0)) {
            PrintName(ctx,(VmValue *)instruction_00,false,false);
            OutputContext::Print(ctx->output,"\n",1);
          }
          else {
            PrintInstruction(ctx,instruction_00);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 < (instruction->arguments).count);
        uVar16 = ctx->depth - 1;
      }
      ctx->depth = uVar16;
      return;
    }
    if ((instruction->arguments).count != 0) {
      uVar21 = 0;
      do {
        pVVar10 = (instruction->arguments).data[uVar21];
        pcVar15 = ", ";
        if (uVar21 == 0) {
          pcVar15 = " ";
        }
        Print(ctx,pcVar15);
        PrintName(ctx,pVVar10,false,false);
        uVar21 = uVar21 + 1;
      } while (uVar21 < (instruction->arguments).count);
    }
    uVar4 = (instruction->super_VmValue).type.type;
    uVar6 = (instruction->super_VmValue).type.size;
    auVar23._4_4_ = -(uint)(uVar4 == 0);
    auVar23._0_4_ = -(uint)(uVar4 == 0);
    auVar23._8_4_ = -(uint)(uVar6 == 0);
    auVar23._12_4_ = -(uint)(uVar6 == 0);
    iVar11 = movmskpd(0x204308,auVar23);
    if (iVar11 == 3) {
      Print(ctx," // %%%d",(ulong)instruction->uniqueId);
    }
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void PrintInstruction(InstructionVMGraphContext &ctx, VmInstruction *instruction)
{
	if(ctx.showSource && instruction->source && !instruction->source->isInternal)
	{
		const char *start = instruction->source->pos.begin;
		const char *end = start + 1;

		// TODO: handle source locations from imported modules
		while(start > ctx.code && *(start - 1) != '\r' && *(start - 1) != '\n')
			start--;

		while(*end && *end != '\r' && *end != '\n')
			end++;

		if (ctx.showAnnotatedSource)
		{
			unsigned startOffset = unsigned(instruction->source->pos.begin - start);
			unsigned endOffset = unsigned(instruction->source->pos.end - start);

			if(start != ctx.lastStart || startOffset != ctx.lastStartOffset || endOffset != ctx.lastEndOffset)
			{
				Print(ctx, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx);
				PrintIndent(ctx);

				if (instruction->source->pos.end < end)
				{
					Print(ctx, "// ");

					for (unsigned i = 0; i < startOffset; i++)
					{
						Print(ctx, " ");

						if (start[i] == '\t')
							Print(ctx, i == 0 ? "  " : "   ");
					}

					for (unsigned i = startOffset; i < endOffset; i++)
					{
						Print(ctx, "~");

						if (start[i] == '\t')
							Print(ctx, i == 0 ? "~~" : "~~~");
					}

					PrintLine(ctx);
					PrintIndent(ctx);
				}

				ctx.lastStart = start;
				ctx.lastStartOffset = startOffset;
				ctx.lastEndOffset = endOffset;
			}
		}
		else
		{
			if(start != ctx.lastStart)
			{
				Print(ctx, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx);
				PrintIndent(ctx);

				ctx.lastStart = start;
			}
		}
	}

	PrintUsers(ctx, instruction, false);

	if(instruction->type != VmType::Void)
	{
		if(ctx.showTypes)
		{
			PrintType(ctx, instruction->type);
			Print(ctx, " ");
		}

		Print(ctx, "%%%d", instruction->uniqueId);

		if(instruction->color)
			Print(ctx, ".c%d", instruction->color);

		if(!instruction->regVmRegisters.empty())
		{
			Print(ctx, ".r");

			for(unsigned i = 0; i < instruction->regVmRegisters.size(); i++)
				Print(ctx, i == 0 ? "%d" : "|%d", instruction->regVmRegisters[i]);
		}

		if(ctx.showComments && !instruction->comment.empty())
			Print(ctx, " (%.*s)", FMT_ISTR(instruction->comment));

		if (ctx.showFullTypes)
		{
			if (instruction->type.structType)
			{
				Print(ctx, " <%.*s>", FMT_ISTR(instruction->type.structType->name));
			}
			else
			{
				Print(ctx, " <");
				PrintType(ctx, instruction->type);
				Print(ctx, ">");
			}
		}

		Print(ctx, " = ");
	}

	Print(ctx, "%s", GetInstructionName(instruction));

	if(instruction->cmd == VM_INST_PHI)
	{
		Print(ctx, " [");

		for(unsigned i = 0; i < instruction->arguments.size(); i += 2)
		{
			VmValue *value = instruction->arguments[i];
			VmValue *edge = instruction->arguments[i + 1];

			if(i != 0)
				Print(ctx, ", ");

			PrintName(ctx, value, false, false);
			Print(ctx, " from ");
			PrintName(ctx, edge, false, false);
		}

		Print(ctx, "]");
		PrintLine(ctx);

		return;
	}

	if(ctx.displayAsTree)
	{
		if(instruction->type == VmType::Void)
			Print(ctx, " // %%%d", instruction->uniqueId);

		PrintLine(ctx);

		ctx.depth++;

		for(unsigned i = 0; i < instruction->arguments.size(); i++)
		{
			VmValue *value = instruction->arguments[i];

			PrintIndent(ctx);

			VmInstruction *inst = getType<VmInstruction>(value);

			if(inst && !inst->users.empty())
			{
				PrintInstruction(ctx, inst);
			}
			else
			{
				PrintName(ctx, value, false, false);
				PrintLine(ctx);
			}
		}

		ctx.depth--;
	}
	else
	{
		for(unsigned i = 0; i < instruction->arguments.size(); i++)
		{
			VmValue *value = instruction->arguments[i];

			if(i == 0)
				Print(ctx, " ");
			else
				Print(ctx, ", ");

			PrintName(ctx, value, false, false);
		}

		if(instruction->type == VmType::Void)
			Print(ctx, " // %%%d", instruction->uniqueId);

		PrintLine(ctx);
	}
}